

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

lys_node * lys_parent(lys_node *node)

{
  lys_node *plVar1;
  
  if (node == (lys_node *)0x0) {
    return (lys_node *)0x0;
  }
  if (node->nodetype == LYS_EXT) {
    if (node->padding[1] != '\x01') {
      return (lys_node *)0x0;
    }
    plVar1 = (lys_node *)node->dsc;
  }
  else {
    plVar1 = node->parent;
    if (plVar1 == (lys_node *)0x0) {
      return (lys_node *)0x0;
    }
  }
  if (plVar1->nodetype == LYS_AUGMENT) {
    plVar1 = plVar1->prev;
  }
  return plVar1;
}

Assistant:

lys_node *
lys_parent(const struct lys_node *node)
{
    struct lys_node *parent;

    if (!node) {
        return NULL;
    }

    if (node->nodetype == LYS_EXT) {
        if (((struct lys_ext_instance_complex*)node)->parent_type != LYEXT_PAR_NODE) {
            return NULL;
        }
        parent = (struct lys_node*)((struct lys_ext_instance_complex*)node)->parent;
    } else if (!node->parent) {
        return NULL;
    } else {
        parent = node->parent;
    }

    if (parent->nodetype == LYS_AUGMENT) {
        return ((struct lys_node_augment *)parent)->target;
    } else {
        return parent;
    }
}